

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O1

void FT_Vector_Unit(FT_Vector *vec,FT_Angle angle)

{
  if (vec != (FT_Vector *)0x0) {
    vec->x = 0xdbd95b;
    vec->y = 0;
    ft_trig_pseudo_rotate(vec,angle);
    vec->x = vec->x + 0x80 >> 8;
    vec->y = vec->y + 0x80 >> 8;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Unit( FT_Vector*  vec,
                  FT_Angle    angle )
  {
    if ( !vec )
      return;

    vec->x = FT_TRIG_SCALE >> 8;
    vec->y = 0;
    ft_trig_pseudo_rotate( vec, angle );
    vec->x = ( vec->x + 0x80L ) >> 8;
    vec->y = ( vec->y + 0x80L ) >> 8;
  }